

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point2f pbrt::InvertUniformTriangleSample(array<float,_3> *b)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  
  fVar1 = b->values[0];
  fVar2 = b->values[1];
  bVar4 = fVar2 < fVar1;
  auVar3 = vinsertps_avx(ZEXT416((uint)bVar4 * (int)(fVar1 + fVar2) +
                                 (uint)!bVar4 * (int)(fVar1 + fVar1)),
                         ZEXT416((uint)bVar4 * (int)(fVar2 + fVar2) +
                                 (uint)!bVar4 * (int)(fVar1 + fVar2)),0x10);
  return (Point2f)auVar3._0_8_;
}

Assistant:

PBRT_CPU_GPU
inline Point2f InvertUniformTriangleSample(const pstd::array<Float, 3> &b) {
    if (b[0] > b[1]) {
        // b0 = u[0] - u[1] / 2, b1 = u[1] / 2
        return {b[0] + b[1], 2 * b[1]};
    } else {
        // b1 = u[1] - u[0] / 2, b0 = u[0] / 2
        return {2 * b[0], b[1] + b[0]};
    }
}